

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1540.c
# Opt level: O2

int test(char *URL)

{
  int iVar1;
  undefined8 uVar2;
  CURL *pCVar3;
  undefined8 uVar4;
  undefined8 uStack_40;
  transfer_status st;
  
  tv_test_start = tutil_tvnow();
  st.easy = (CURL *)0x0;
  st.halted = 0;
  st.counter = 0;
  st.please = 0;
  st._20_4_ = 0;
  iVar1 = curl_global_init(3);
  uVar4 = _stderr;
  if (iVar1 != 0) {
    uVar2 = curl_easy_strerror(iVar1);
    curl_mfprintf(uVar4,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/DarovskikhAndrei[P]curl/tests/libtest/lib1540.c"
                  ,0x5f,iVar1,uVar2);
    goto LAB_001024e3;
  }
  pCVar3 = (CURL *)curl_easy_init();
  if (pCVar3 == (CURL *)0x0) {
    curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/DarovskikhAndrei[P]curl/tests/libtest/lib1540.c"
                  ,0x61);
    iVar1 = 0x7c;
  }
  else {
    st.easy = pCVar3;
    iVar1 = curl_easy_setopt(pCVar3,0x2712,URL);
    uVar4 = _stderr;
    if (iVar1 == 0) {
      iVar1 = curl_easy_setopt(pCVar3,0x4e2b,write_callback);
      uVar4 = _stderr;
      if (iVar1 == 0) {
        iVar1 = curl_easy_setopt(pCVar3,0x2711,&st);
        uVar4 = _stderr;
        if (iVar1 == 0) {
          iVar1 = curl_easy_setopt(pCVar3,0x4e6f,header_callback);
          uVar4 = _stderr;
          if (iVar1 == 0) {
            iVar1 = curl_easy_setopt(pCVar3,0x272d,&st);
            uVar4 = _stderr;
            if (iVar1 == 0) {
              iVar1 = curl_easy_setopt(pCVar3,0x4efb,please_continue);
              uVar4 = _stderr;
              if (iVar1 == 0) {
                iVar1 = curl_easy_setopt(pCVar3,0x2749,&st);
                uVar4 = _stderr;
                if (iVar1 == 0) {
                  iVar1 = curl_easy_setopt(pCVar3,0x2b,0);
                  uVar4 = _stderr;
                  if (iVar1 == 0) {
                    iVar1 = curl_easy_perform(pCVar3);
                    goto LAB_001024d6;
                  }
                  uVar2 = curl_easy_strerror(iVar1);
                  uStack_40 = 0x6c;
                }
                else {
                  uVar2 = curl_easy_strerror(iVar1);
                  uStack_40 = 0x6b;
                }
              }
              else {
                uVar2 = curl_easy_strerror(iVar1);
                uStack_40 = 0x6a;
              }
            }
            else {
              uVar2 = curl_easy_strerror(iVar1);
              uStack_40 = 0x68;
            }
          }
          else {
            uVar2 = curl_easy_strerror(iVar1);
            uStack_40 = 0x67;
          }
        }
        else {
          uVar2 = curl_easy_strerror(iVar1);
          uStack_40 = 0x66;
        }
      }
      else {
        uVar2 = curl_easy_strerror(iVar1);
        uStack_40 = 0x65;
      }
    }
    else {
      uVar2 = curl_easy_strerror(iVar1);
      uStack_40 = 100;
    }
    curl_mfprintf(uVar4,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/DarovskikhAndrei[P]curl/tests/libtest/lib1540.c"
                  ,uStack_40,iVar1,uVar2);
  }
LAB_001024d6:
  curl_easy_cleanup(pCVar3);
  curl_global_cleanup();
LAB_001024e3:
  return iVar1;
}

Assistant:

int test(char *URL)
{
  CURL *curls = NULL;
  int i = 0;
  int res = 0;
  struct transfer_status st;

  start_test_timing();

  memset(&st, 0, sizeof(st));

  global_init(CURL_GLOBAL_ALL);

  easy_init(curls);
  st.easy = curls; /* to allow callbacks access */

  easy_setopt(curls, CURLOPT_URL, URL);
  easy_setopt(curls, CURLOPT_WRITEFUNCTION, write_callback);
  easy_setopt(curls, CURLOPT_WRITEDATA, &st);
  easy_setopt(curls, CURLOPT_HEADERFUNCTION, header_callback);
  easy_setopt(curls, CURLOPT_HEADERDATA, &st);

  easy_setopt(curls, CURLOPT_XFERINFOFUNCTION, please_continue);
  easy_setopt(curls, CURLOPT_XFERINFODATA, &st);
  easy_setopt(curls, CURLOPT_NOPROGRESS, 0L);

  res = curl_easy_perform(curls);

test_cleanup:

  curl_easy_cleanup(curls);
  curl_global_cleanup();

  if(res)
    i = res;

  return i; /* return the final return code */
}